

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplePreprocessor.hpp
# Opt level: O0

bool __thiscall
OpenMD::SimplePreprocessor::doPreprocess
          (SimplePreprocessor *this,istream *myStream,string *filename,int startingLine,ostream *os,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defineSet,stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *ifStates)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  long *plVar4;
  ulong uVar5;
  char *pcVar6;
  size_type sVar7;
  undefined8 uVar8;
  reference pvVar9;
  int in_ECX;
  istream *in_RDX;
  SimplePreprocessor *in_RSI;
  ostream *in_R8;
  string *in_R9;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *unaff_retaddr;
  key_type *in_stack_00000008;
  bool ret;
  stringstream ss;
  ifstream includeStream;
  string includeFilename;
  SimplePreprocessor subPreprocessor;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  StringTokenizer tokenizer;
  string line;
  char buffer [8192];
  int bufferSize;
  int lineNo;
  key_type *in_stack_ffffffffffffd948;
  StringTokenizer *in_stack_ffffffffffffd950;
  string *in_stack_ffffffffffffd958;
  OpenMDException *in_stack_ffffffffffffd960;
  string *in_stack_ffffffffffffd968;
  string *in_stack_ffffffffffffd970;
  undefined7 in_stack_ffffffffffffd980;
  undefined1 in_stack_ffffffffffffd987;
  string *in_stack_ffffffffffffd988;
  iterator in_stack_ffffffffffffd990;
  undefined7 in_stack_ffffffffffffd998;
  undefined1 in_stack_ffffffffffffd99f;
  _Self local_2598;
  _Self local_2590;
  undefined1 local_2582;
  undefined1 local_2581;
  _Self local_2580;
  _Self local_2578;
  _Base_ptr local_2570;
  undefined1 local_2568;
  undefined1 local_255a;
  undefined1 local_2559;
  stringstream local_2538 [16];
  ostream local_2528 [376];
  undefined1 local_23b0 [520];
  string local_21a8 [32];
  string local_2188 [36];
  uint local_2164;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2160;
  allocator<char> local_2141;
  string local_2140 [32];
  string local_2120 [120];
  locale local_20a8 [31];
  allocator<char> local_2089;
  string local_2088 [32];
  string local_2068 [32];
  char local_2048 [8200];
  undefined4 uVar11;
  string *psVar12;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar13;
  byte local_1;
  
  iVar13 = in_ECX;
  poVar3 = std::operator<<(in_R8,"#line ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ECX);
  poVar3 = std::operator<<(poVar3," \"");
  poVar3 = std::operator<<(poVar3,(string *)in_RDX);
  std::operator<<(poVar3,"\"\n");
  uVar11 = 0x2000;
  do {
    plVar4 = (long *)std::istream::getline((char *)in_RSI,(long)local_2048);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    if (!bVar1) {
      local_1 = 1;
      break;
    }
    in_ECX = in_ECX + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffd990._M_node,(char *)in_stack_ffffffffffffd988,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
    std::locale::locale(local_20a8);
    Utils::trimLeftCopy(in_stack_ffffffffffffd968,(locale *)in_stack_ffffffffffffd960);
    std::locale::~locale(local_20a8);
    std::__cxx11::string::~string(local_2088);
    std::allocator<char>::~allocator(&local_2089);
    uVar5 = std::__cxx11::string::empty();
    if (((uVar5 & 1) == 0) &&
       (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_2068), *pcVar6 == '#')) {
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_2120,(ulong)local_2068);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd990._M_node,(char *)in_stack_ffffffffffffd988,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
      StringTokenizer::StringTokenizer
                ((StringTokenizer *)in_stack_ffffffffffffd990._M_node,in_stack_ffffffffffffd988,
                 (string *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
      std::__cxx11::string::~string(local_2140);
      std::allocator<char>::~allocator(&local_2141);
      std::__cxx11::string::~string(local_2120);
      StringTokenizer::getAllTokens_abi_cxx11_
                ((StringTokenizer *)CONCAT17(in_stack_ffffffffffffd99f,in_stack_ffffffffffffd998));
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffd960);
      if (bVar1) {
        local_1 = 0;
        local_2164 = 1;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_2160,0);
        bVar1 = std::operator==(&in_stack_ffffffffffffd950->tokenString_,
                                (char *)in_stack_ffffffffffffd948);
        if (bVar1) {
          std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::pop
                    ((stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *)0x1658e3);
          bVar1 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::empty
                            ((stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *)0x1658f2);
          if (!bVar1) {
            std::ostream::operator<<(in_R8,std::endl<char,std::char_traits<char>>);
            goto LAB_00166127;
          }
          std::operator<<((ostream *)&std::cout,"Error in preprocessing: endif \n");
          local_1 = 0;
          local_2164 = 1;
        }
        else {
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_2160);
          if (sVar7 == 2) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_2160,0);
            bVar1 = std::operator==(&in_stack_ffffffffffffd950->tokenString_,
                                    (char *)in_stack_ffffffffffffd948);
            if (bVar1) {
              pvVar9 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&local_2160,1);
              std::__cxx11::string::string(local_2188,(string *)pvVar9);
              std::__cxx11::string::length();
              std::__cxx11::string::substr((ulong)local_21a8,(ulong)local_2188);
              std::__cxx11::string::operator=(local_2188,local_21a8);
              std::__cxx11::string::~string(local_21a8);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              std::ifstream::ifstream(local_23b0,pcVar6,_S_in);
              bVar2 = std::ifstream::is_open();
              if ((bVar2 & 1) == 0) {
                std::__cxx11::stringstream::stringstream(local_2538);
                poVar3 = std::operator<<(local_2528,"Can not open ");
                poVar3 = std::operator<<(poVar3,local_2188);
                std::operator<<(poVar3," for preprocessing\n");
                local_2559 = 1;
                uVar8 = __cxa_allocate_exception(0x28);
                std::__cxx11::stringstream::str();
                OpenMDException::OpenMDException
                          (in_stack_ffffffffffffd960,in_stack_ffffffffffffd958);
                local_2559 = 0;
                __cxa_throw(uVar8,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
              }
              in_stack_ffffffffffffd948 = in_stack_00000008;
              bVar1 = doPreprocess(in_RSI,in_RDX,
                                   (string *)CONCAT44(iVar13,in_stack_ffffffffffffffd8),
                                   (int)((ulong)in_R8 >> 0x20),(ostream *)in_R9,
                                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)CONCAT44(in_ECX,uVar11),unaff_retaddr);
              local_255a = bVar1;
              if (bVar1) {
                poVar3 = std::operator<<(in_R8,"#line ");
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ECX);
                poVar3 = std::operator<<(poVar3," \"");
                poVar3 = std::operator<<(poVar3,(string *)in_RDX);
                std::operator<<(poVar3,"\"\n");
              }
              else {
                std::operator<<((ostream *)&std::cout,"Error in preprocessing\n");
                local_1 = 0;
              }
              local_2164 = (uint)!bVar1;
              std::ifstream::~ifstream(local_23b0);
              std::__cxx11::string::~string(local_2188);
              if (local_2164 != 0) goto LAB_00166132;
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_2160,0);
              bVar1 = std::operator==(&in_stack_ffffffffffffd950->tokenString_,
                                      (char *)in_stack_ffffffffffffd948);
              if (bVar1) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_2160,1);
                pVar10 = std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_ffffffffffffd970,in_stack_ffffffffffffd968);
                local_2570 = (_Base_ptr)pVar10.first._M_node;
                local_2568 = pVar10.second;
                std::ostream::operator<<(in_R8,std::endl<char,std::char_traits<char>>);
              }
              else {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_2160,0);
                bVar1 = std::operator==(&in_stack_ffffffffffffd950->tokenString_,
                                        (char *)in_stack_ffffffffffffd948);
                if (bVar1) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_2160,1);
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::erase((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_ffffffffffffd950,in_stack_ffffffffffffd948);
                  std::ostream::operator<<(in_R8,std::endl<char,std::char_traits<char>>);
                }
                else {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_2160,0);
                  in_stack_ffffffffffffd99f =
                       std::operator==(&in_stack_ffffffffffffd950->tokenString_,
                                       (char *)in_stack_ffffffffffffd948);
                  if ((bool)in_stack_ffffffffffffd99f) {
                    psVar12 = in_R9;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&local_2160,1);
                    in_stack_ffffffffffffd990 =
                         std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_ffffffffffffd958,
                                &in_stack_ffffffffffffd950->tokenString_);
                    local_2578._M_node = in_stack_ffffffffffffd990._M_node;
                    local_2580._M_node =
                         (_Base_ptr)
                         std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_ffffffffffffd948);
                    bVar1 = std::operator!=(&local_2578,&local_2580);
                    if (bVar1) {
                      local_2581 = 1;
                      std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::push
                                ((stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *)
                                 in_stack_ffffffffffffd950,(value_type *)in_stack_ffffffffffffd948);
                    }
                    else {
                      local_2582 = 0;
                      std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::push
                                ((stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *)
                                 in_stack_ffffffffffffd950,(value_type *)in_stack_ffffffffffffd948);
                    }
                    std::ostream::operator<<(in_R8,std::endl<char,std::char_traits<char>>);
                    in_stack_ffffffffffffd988 = in_R9;
                    in_R9 = psVar12;
                  }
                  else {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&local_2160,0);
                    in_stack_ffffffffffffd987 =
                         std::operator==(&in_stack_ffffffffffffd950->tokenString_,
                                         (char *)in_stack_ffffffffffffd948);
                    if (!(bool)in_stack_ffffffffffffd987) {
                      pvVar9 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[](&local_2160,0);
                      in_stack_ffffffffffffd968 =
                           (string *)std::operator<<((ostream *)&std::cout,(string *)pvVar9);
                      in_stack_ffffffffffffd960 =
                           (OpenMDException *)
                           std::operator<<((ostream *)in_stack_ffffffffffffd968,
                                           " is not supported (yet).");
                      std::ostream::operator<<
                                (in_stack_ffffffffffffd960,std::endl<char,std::char_traits<char>>);
                      local_1 = 0;
                      local_2164 = 1;
                      goto LAB_00166132;
                    }
                    psVar12 = in_R9;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&local_2160,1);
                    local_2590._M_node =
                         (_Base_ptr)
                         std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_ffffffffffffd958,
                                &in_stack_ffffffffffffd950->tokenString_);
                    local_2598._M_node =
                         (_Base_ptr)
                         std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_ffffffffffffd948);
                    bVar1 = std::operator==(&local_2590,&local_2598);
                    if (bVar1) {
                      std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::push
                                ((stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *)
                                 in_stack_ffffffffffffd950,(value_type *)in_stack_ffffffffffffd948);
                    }
                    else {
                      std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::push
                                ((stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *)
                                 in_stack_ffffffffffffd950,(value_type *)in_stack_ffffffffffffd948);
                    }
                    std::ostream::operator<<(in_R8,std::endl<char,std::char_traits<char>>);
                    in_stack_ffffffffffffd970 = in_R9;
                    in_R9 = psVar12;
                  }
                }
              }
            }
LAB_00166127:
            local_2164 = 0;
          }
          else {
            local_1 = 0;
            local_2164 = 1;
          }
        }
      }
LAB_00166132:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffd960);
      StringTokenizer::~StringTokenizer(in_stack_ffffffffffffd950);
      if (local_2164 == 0) goto LAB_001661c8;
    }
    else {
      in_stack_ffffffffffffd958 =
           (string *)
           std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::top
                     ((stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *)0x166184);
      if (((byte)in_stack_ffffffffffffd958->_M_dataplus & 1) != 0) {
        in_stack_ffffffffffffd950 = (StringTokenizer *)std::operator<<(in_R8,local_2048);
        std::ostream::operator<<(in_stack_ffffffffffffd950,std::endl<char,std::char_traits<char>>);
      }
LAB_001661c8:
      local_2164 = 0;
    }
    std::__cxx11::string::~string(local_2068);
  } while (local_2164 == 0);
  return (bool)(local_1 & 1);
}

Assistant:

bool doPreprocess(std::istream& myStream, const std::string& filename, int startingLine, ostream& os, std::set<std::string>& defineSet, std::stack<bool>& ifStates) {
            //std::ifstream input(filename.c_str());
            //if (!input.is_open()) {
            //    std::stringstream ss;
            //    ss << "Can not open " << filename << " for preprocessing\n";
            //    
            //    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            //            "Can not open (%s) for processing. \n"
            //            "\tPlease check md file name syntax.\n", filename.c_str());
            //    
            //    painCave.isFatal = 1;
            //    simError();
            //    
            //    throw OpenMDException(ss.str());                
            //}
            int lineNo = startingLine;
            os << "#line " << lineNo << " \"" << filename << "\"\n";
            const int bufferSize = 8192;
            char buffer[bufferSize];
            while(myStream.getline(buffer, bufferSize)) {
              ++lineNo;
              std::string line = Utils::trimLeftCopy(buffer);
              if (!line.empty() && line[0] == '#') {
                    StringTokenizer tokenizer(line.substr(1, line.length()));
                    std::vector<std::string> tokens = tokenizer.getAllTokens();
                    if (tokens.empty()) {
                        return false;
                    }
                    if (tokens[0] == "endif") {
                        ifStates.pop();
                        if (ifStates.empty()) {
                            std::cout << "Error in preprocessing: endif \n";
                            return false;
                        }
                        os << std::endl;                        
                    } else if (tokens.size() == 2) {
                        if (tokens[0] == "include") {
                            SimplePreprocessor subPreprocessor;
                            std::string includeFilename = tokens[1];
                            includeFilename = includeFilename.substr(1, includeFilename.length() -2);
                            std::ifstream includeStream(includeFilename.c_str());
                            if (!includeStream.is_open()) {
                                std::stringstream ss;
                                ss << "Can not open " << includeFilename << " for preprocessing\n";
                                throw OpenMDException(ss.str()); 
                            }
                            
                            bool ret = subPreprocessor.doPreprocess(includeStream, includeFilename, 1, os, defineSet, ifStates);
                            if (!ret) {
                                std::cout << "Error in preprocessing\n";
                                return false;
                            }
                            os << "#line " << lineNo << " \"" << filename << "\"\n";
                        } else if (tokens[0] == "define") {
                           defineSet.insert(tokens[1]);
                           os << std::endl;
                        } else if (tokens[0] == "undef") {
                           defineSet.erase(tokens[1]);
                           os << std::endl;
                        } else if (tokens[0] == "ifdef") {
                           if (defineSet.find(tokens[1]) != defineSet.end() ) {
                                ifStates.push(true);
                           } else {
                              ifStates.push(false);
                           }
                           os << std::endl;
                        } else if (tokens[0] == "ifndef") {
                           if (defineSet.find(tokens[1]) == defineSet.end() ) {
                                ifStates.push(true);
                           } else {
                              ifStates.push(false);
                           }
                           os << std::endl;
                        } else {
                            std::cout << tokens[0] << " is not supported (yet)." << std::endl;
                            return false;
                        }
                    }else {
                        return false;
                    }
                    
              }else if (ifStates.top()){
                os << buffer << std::endl;
              }
              
            }

            return true;
        }